

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Spill(CWriter *this,TypeVector *types)

{
  StackVar *u;
  byte bVar1;
  StackVar *pSVar2;
  char (*u_00) [2];
  long lVar3;
  Newline *in_R8;
  uint uVar4;
  ulong uVar5;
  StackVar local_40;
  
  pSVar2 = (StackVar *)
           (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  u = (StackVar *)
      (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish;
  lVar3 = (long)u - (long)pSVar2 >> 3;
  if (lVar3 == 1) {
    local_40.index = (int)((ulong)((long)u - (long)pSVar2) >> 3) - 1;
    local_40.type.enum_ = Any;
    local_40.type.type_index_ = 0;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [7])&local_40,u,(char (*) [2])0x0,in_R8);
  }
  else {
    if (lVar3 == 0) {
      __assert_fail("types.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xba2,
                    "void wabt::(anonymous namespace)::CWriter::Spill(const TypeVector &, const sources &) [sources = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2992:16)]"
                   );
    }
    if (u != pSVar2) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        bVar1 = MangleType(*(Type *)(&pSVar2->index + uVar5 * 2));
        Writef(this,"tmp.%c%d = ",(ulong)bVar1,(ulong)(uVar4 - 1));
        local_40.index =
             (int)((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) + ~(uint)uVar5;
        local_40.type.enum_ = Any;
        local_40.type.type_index_ = 0;
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,&local_40,u_00,(Newline *)0x0);
        uVar5 = (ulong)uVar4;
        pSVar2 = (StackVar *)
                 (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = uVar4 + 1;
      } while (uVar5 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3))
      ;
    }
  }
  return;
}

Assistant:

void CWriter::Spill(const TypeVector& types) {
  Spill(types, [&](auto i) { return StackVar(types.size() - i - 1); });
}